

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::DefineGroupNode::Emit(DefineGroupNode *this,Compiler *compiler,CharCount *skipped)

{
  CompilationScheme CVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Node *pNVar6;
  CharSet<char16_t> *this_00;
  code *pcVar7;
  bool bVar8;
  char16 c_00;
  ThreadContext *this_01;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this_02;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *this_03;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *this_04;
  DefineGroupFixedInst *this_05;
  undefined4 *puVar9;
  BeginDefineGroupInst *this_06;
  EndDefineGroupInst *this_07;
  SetMixin<false> *local_48;
  RuntimeCharSet<char16_t> *runtimeSet;
  Char c;
  CountDomain *repeats;
  CharSet<char16_t> *loopBodyFirstSet;
  LoopNode *loop;
  CharCount *skipped_local;
  Compiler *compiler_local;
  DefineGroupNode *this_local;
  
  this_01 = Js::ScriptContext::GetThreadContext(compiler->scriptContext);
  ThreadContext::ProbeStackNoDispose(this_01,0x6000,compiler->scriptContext,(PVOID)0x0);
  CVar1 = this->scheme;
  if (CVar1 == Chomp) {
    if (this->body->tag != Loop) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcd9,"(body->tag == NodeTag::Loop)","body->tag == NodeTag::Loop");
      if (!bVar8) {
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pNVar6 = this->body;
    this_00 = (CharSet<char16_t> *)pNVar6[1]._vptr_Node[2];
    uVar2._0_2_ = pNVar6[1].tag;
    uVar2._2_2_ = pNVar6[1].features;
    if ((1 < uVar2) || (bVar8 = CountDomain::IsUnbounded((CountDomain *)&pNVar6[1].tag), !bVar8)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcdd,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                         "repeats.lower <= 1 && repeats.IsUnbounded()");
      if (!bVar8) {
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    bVar8 = CharSet<char16_t>::IsSingleton(this_00);
    if (bVar8) {
      c_00 = CharSet<char16_t>::Singleton(this_00);
      iVar3._0_2_ = pNVar6[1].tag;
      iVar3._2_2_ = pNVar6[1].features;
      if (iVar3 == 0) {
        this_02 = (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)Compiler::Emit(compiler,8);
        ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::ChompCharGroupInst
                  (this_02,c_00,this->groupId,(bool)(this->noNeedToSave & 1));
      }
      else {
        this_03 = (ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)Compiler::Emit(compiler,8);
        ChompCharGroupInst<(UnifiedRegex::ChompMode)1>::ChompCharGroupInst
                  (this_03,c_00,this->groupId,(bool)(this->noNeedToSave & 1));
      }
    }
    else {
      uVar4._0_2_ = pNVar6[1].tag;
      uVar4._2_2_ = pNVar6[1].features;
      if ((1 < uVar4) || (bVar8 = CountDomain::IsUnbounded((CountDomain *)&pNVar6[1].tag), !bVar8))
      {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                           ,0xce8,"(repeats.lower <= 1 && repeats.IsUnbounded())",
                           "repeats.lower <= 1 && repeats.IsUnbounded()");
        if (!bVar8) {
          pcVar7 = (code *)invalidInstructionException();
          (*pcVar7)();
        }
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar9 = 0;
      }
      iVar5._0_2_ = pNVar6[1].tag;
      iVar5._2_2_ = pNVar6[1].features;
      if (iVar5 == 0) {
        this_04 = (ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)Compiler::Emit(compiler,0x2e);
        ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::ChompSetGroupInst
                  (this_04,this->groupId,(bool)(this->noNeedToSave & 1));
      }
      else {
        this_04 = (ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)Compiler::Emit(compiler,0x2e);
        ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::ChompSetGroupInst
                  ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)this_04,this->groupId,
                   (bool)(this->noNeedToSave & 1));
      }
      local_48 = &this_04->super_SetMixin<false>;
      RuntimeCharSet<char16_t>::CloneFrom(&local_48->set,compiler->rtAllocator,this_00);
    }
  }
  else if (CVar1 == Fixed) {
    bVar8 = CountDomain::IsFixed(&this->body->thisConsumes);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xcf9,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar8) {
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    this_05 = (DefineGroupFixedInst *)Compiler::Emit(compiler,10);
    DefineGroupFixedInst::DefineGroupFixedInst
              (this_05,this->groupId,(this->body->thisConsumes).lower,(bool)(this->noNeedToSave & 1)
              );
  }
  else if (CVar1 == BeginEnd) {
    if (*skipped != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xd06,"(skipped == 0)","skipped == 0");
      if (!bVar8) {
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    this_06 = (BeginDefineGroupInst *)Compiler::Emit(compiler,5);
    BeginDefineGroupInst::BeginDefineGroupInst(this_06,this->groupId);
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    this_07 = (EndDefineGroupInst *)Compiler::Emit(compiler,6);
    EndDefineGroupInst::EndDefineGroupInst(this_07,this->groupId,(bool)(this->noNeedToSave & 1));
  }
  return;
}

Assistant:

void DefineGroupNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        switch (scheme)
        {
            case Chomp:
            {
                // Compilation scheme:
                //
                //   Chomp(Char|Set)Group
                Assert(body->tag == NodeTag::Loop);
                const LoopNode *const loop = static_cast<const LoopNode *>(body);
                const CharSet<Char> *const loopBodyFirstSet = loop->body->firstSet;
                const CountDomain &repeats = loop->repeats;
                Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                if(loopBodyFirstSet->IsSingleton())
                {
                    const Char c = loopBodyFirstSet->Singleton();
                    if(repeats.lower == 0)
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Star>, c, groupId, noNeedToSave);
                    else
                        EMIT(compiler, ChompCharGroupInst<ChompMode::Plus>, c, groupId, noNeedToSave);
                }
                else
                {
                    Assert(repeats.lower <= 1 && repeats.IsUnbounded());
                    RuntimeCharSet<Char> *runtimeSet;
                    if(repeats.lower == 0)
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Star>, groupId, noNeedToSave)->set;
                    else
                        runtimeSet = &EMIT(compiler, ChompSetGroupInst<ChompMode::Plus>, groupId, noNeedToSave)->set;
                    runtimeSet->CloneFrom(compiler.rtAllocator, *loopBodyFirstSet);
                }
                break;
            }

            case Fixed:
            {
                // Compilation scheme:
                //
                //   <body>
                //   DefineGroup
                Assert(body->thisConsumes.IsFixed());
                body->Emit(compiler, skipped);
                EMIT(compiler, DefineGroupFixedInst, groupId, body->thisConsumes.lower, noNeedToSave);
                break;
            }

            case BeginEnd:
            {
                // Compilation scheme:
                //
                //   BeginDefineGroup
                //   <body>
                //   EndDefineGroup
                Assert(skipped == 0);
                EMIT(compiler, BeginDefineGroupInst, groupId);
                body->Emit(compiler, skipped);
                EMIT(compiler, EndDefineGroupInst, groupId, noNeedToSave);
                break;
            }
        }
    }